

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O3

bool __thiscall
ViconCGStreamClientSDK::VCGClient::WaitFrames
          (VCGClient *this,
          vector<ViconCGStreamClientSDK::ICGFrameState,_std::allocator<ViconCGStreamClientSDK::ICGFrameState>_>
          *o_rFrames,uint i_TimeoutMs)

{
  bool bVar1;
  int iVar2;
  time_duration_type tVar3;
  undefined1 uVar4;
  scoped_lock Lock;
  system_time local_70;
  unique_lock<boost::recursive_mutex> local_68;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_58;
  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  local_50;
  int_adapter<long> local_48;
  xtime local_40;
  
  local_68.m = &this->m_ClientMutex;
  local_68.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_68);
  local_58.time_.time_count_.value_ =
       (time_rep_type)
       boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                 (boost::date_time::c_time::gmtime);
  local_48.value_._0_4_ = 0x253d8c;
  local_70.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(time_rep_type)0x0;
  boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
  counted_time_rep((counted_time_rep<boost::posix_time::millisec_posix_time_system_config> *)
                   &local_50,(date_type *)&local_48,(time_duration_type *)&local_70);
  if ((long)local_50.ticks_.value_ + 0x8000000000000002U < 3) {
    local_70.
    super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    .time_.time_count_.value_ =
         (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          )(base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
            )local_50.ticks_.value_;
    local_48.value_ = 0;
    local_50.ticks_.value_ =
         boost::date_time::int_adapter<long>::operator+((int_adapter<long> *)&local_70,&local_48);
  }
  local_70.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          )local_50.ticks_.value_;
  tVar3 = boost::date_time::
          counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
          ::subtract_times(&local_58.time_,(time_rep_type *)&local_70);
  local_40.sec = (xtime_sec_t)((double)i_TimeoutMs / 1000.0);
  local_40.nsec =
       (local_40.sec * -1000 + (ulong)i_TimeoutMs) * 1000000 +
       ((long)tVar3.
              super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
              .ticks_.value_ % 1000000) * 1000;
  local_40.sec = (long)tVar3.
                       super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                       .ticks_.value_ / 1000000 + local_40.sec;
  do {
    if ((this->m_FrameDeque).
        super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (this->m_FrameDeque).
        super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      iVar2 = (*(this->super_ICGClient)._vptr_ICGClient[0x15])(this,o_rFrames);
      uVar4 = (undefined1)iVar2;
      goto LAB_00156724;
    }
    local_70 = boost::xtime::operator_cast_to_ptime(&local_40);
    bVar1 = boost::condition_variable_any::timed_wait<boost::unique_lock<boost::recursive_mutex>>
                      (&this->m_NewFramesCondition,&local_68,&local_70);
  } while (bVar1);
  uVar4 = 0;
LAB_00156724:
  if (local_68.is_locked == true) {
    boost::recursive_mutex::unlock(local_68.m);
  }
  return (bool)uVar4;
}

Assistant:

bool VCGClient::WaitFrames( std::vector< ICGFrameState > & o_rFrames, unsigned int i_TimeoutMs )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  boost::xtime WaitDeadline;

  // boost::TIME_UTC has been renamed to boost::TIME_UTC_ in Boost 1.50:
  // https://svn.boost.org/trac/boost/ticket/6940
#if BOOST_VERSION >= 105000
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC_ );
#else
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC );
#endif
  boost::xtime::xtime_sec_t  AdditionalSeconds     = static_cast< boost::xtime::xtime_sec_t  >( static_cast< double >( i_TimeoutMs ) / 1000.0 );
  boost::xtime::xtime_nsec_t AdditionalNanoSeconds = static_cast< boost::xtime::xtime_nsec_t >( ( i_TimeoutMs - ( 1000 * AdditionalSeconds ) ) * 1000000 );
 
  WaitDeadline.sec += AdditionalSeconds;
  WaitDeadline.nsec += AdditionalNanoSeconds;

  while( m_FrameDeque.empty() )
  {
    if( !m_NewFramesCondition.timed_wait( Lock, WaitDeadline ) )
    {
      return false;
    }
  }
  
  return PollFrames( o_rFrames );
}